

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall camp::ClassNotFound::ClassNotFound(ClassNotFound *this,string *name)

{
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *name_local;
  ClassNotFound *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "the metaclass ");
  std::operator+(local_38,(char *)local_58);
  Error::Error(&this->super_Error,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  *(undefined ***)&this->super_Error = &PTR__ClassNotFound_001fd3b8;
  return;
}

Assistant:

ClassNotFound::ClassNotFound(const std::string& name)
    : Error("the metaclass " + name + " couldn't be found")
{
}